

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O2

XrResult ApiLayerInterface::GetInstanceExtensionProperties
                   (string *openxr_command,char *layer_name,
                   vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   *extension_properties)

{
  pointer pbVar1;
  pointer pXVar2;
  bool bVar3;
  __type _Var4;
  XrResult XVar5;
  size_t man_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar6;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *exp_layer_man_file;
  pointer __args;
  long lVar7;
  allocator local_89;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  manifest_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  env_enabled_layers;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_48;
  
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manifest_files.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((layer_name == (char *)0x0) || (*layer_name == '\0')) {
    XVar5 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&manifest_files);
    if (XR_ERROR_VALIDATION_FAILURE < XVar5) {
      env_enabled_layers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      env_enabled_layers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      env_enabled_layers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AddEnvironmentApiLayers(&env_enabled_layers);
      if (env_enabled_layers.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          env_enabled_layers.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        XVar5 = ApiLayerManifestFile::FindManifestFiles
                          (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,
                           (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                            *)&local_48);
        pXVar2 = local_48.
                 super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        __args = local_48.
                 super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (XR_ERROR_VALIDATION_FAILURE < XVar5) {
          for (; pbVar1 = env_enabled_layers.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
              __lhs = env_enabled_layers.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, __args != pXVar2;
              __args = (pointer)&__args->type) {
            do {
              if (__lhs == pbVar1) goto LAB_00105f2c;
              _Var4 = std::operator==(__lhs,&((((__uniq_ptr_data<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>,_true,_true>
                                                 *)&__args->handle)->
                                              super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                              )._M_t.
                                              super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                              .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                             _M_head_impl)->_layer_name);
              __lhs = __lhs + 1;
            } while (!_Var4);
            std::
            vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
            ::
            emplace_back<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>
                      ((vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                        *)&manifest_files,
                       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                        *)__args);
LAB_00105f2c:
          }
        }
        std::
        vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
        ::~vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   *)&local_48);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&env_enabled_layers);
    }
    lVar7 = (long)manifest_files.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)manifest_files.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    XVar5 = XR_SUCCESS;
    for (lVar6 = 0; lVar7 >> 3 != lVar6; lVar6 = lVar6 + 1) {
      ManifestFile::GetInstanceExtensionProperties
                (&(manifest_files.
                   super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                   super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                   .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                  super_ManifestFile,extension_properties);
    }
  }
  else {
    XVar5 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&manifest_files);
    if (XVar5 < XR_SUCCESS) {
LAB_00105fcf:
      XVar5 = XR_SUCCESS;
    }
    else {
      XVar5 = ApiLayerManifestFile::FindManifestFiles
                        (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&manifest_files);
      if (XVar5 < XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&env_enabled_layers,
                   "ApiLayerInterface::GetInstanceExtensionProperties - failed searching for API layer manifest files"
                   ,&local_89);
        local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LoaderLogger::LogErrorMessage(openxr_command,(string *)&env_enabled_layers,&local_48);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_48);
        std::__cxx11::string::~string((string *)&env_enabled_layers);
      }
      else {
        lVar7 = (long)manifest_files.
                      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)manifest_files.
                      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        XVar5 = XR_ERROR_API_LAYER_NOT_PRESENT;
        for (lVar6 = 0; lVar7 >> 3 != lVar6; lVar6 = lVar6 + 1) {
          bVar3 = std::operator==(&(manifest_files.
                                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                                    super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                    .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                   _M_head_impl)->_layer_name,layer_name);
          if (bVar3) {
            ManifestFile::GetInstanceExtensionProperties
                      (&(manifest_files.
                         super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                         .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                        super_ManifestFile,extension_properties);
            goto LAB_00105fcf;
          }
        }
      }
    }
  }
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&manifest_files);
  return XVar5;
}

Assistant:

XrResult ApiLayerInterface::GetInstanceExtensionProperties(const std::string& openxr_command, const char* layer_name,
                                                           std::vector<XrExtensionProperties>& extension_properties) {
    std::vector<std::unique_ptr<ApiLayerManifestFile>> manifest_files;

    // If a layer name is supplied, only use the information out of that one layer
    if (nullptr != layer_name && 0 != strlen(layer_name)) {
        XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
        if (XR_SUCCEEDED(result)) {
            // Find any explicit layers which we may need to report information for.
            result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, manifest_files);
            if (XR_FAILED(result)) {
                LoaderLogger::LogErrorMessage(
                    openxr_command,
                    "ApiLayerInterface::GetInstanceExtensionProperties - failed searching for API layer manifest files");
                return result;
            }

            bool found = false;
            size_t num_files = manifest_files.size();
            for (size_t man_file = 0; man_file < num_files; ++man_file) {
                // If a layer with the provided name exists, get it's instance extension information.
                if (manifest_files[man_file]->LayerName() == layer_name) {
                    manifest_files[man_file]->GetInstanceExtensionProperties(extension_properties);
                    found = true;
                    break;
                }
            }

            // If nothing found, report 0
            if (!found) {
                return XR_ERROR_API_LAYER_NOT_PRESENT;
            }
        }
        // Otherwise, we want to add only implicit API layers and explicit API layers enabled using the environment variables
    } else {
        XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
        if (XR_SUCCEEDED(result)) {
            // Find any environmentally enabled explicit layers.  If they're present, treat them like implicit layers
            // since we know that they're going to be enabled.
            std::vector<std::string> env_enabled_layers;
            AddEnvironmentApiLayers(env_enabled_layers);
            if (!env_enabled_layers.empty()) {
                std::vector<std::unique_ptr<ApiLayerManifestFile>> exp_layer_man_files = {};
                result =
                    ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, exp_layer_man_files);
                if (XR_SUCCEEDED(result)) {
                    for (auto& exp_layer_man_file : exp_layer_man_files) {
                        for (std::string& enabled_layer : env_enabled_layers) {
                            // If this is an enabled layer, transfer it over to the manifest list.
                            if (enabled_layer == exp_layer_man_file->LayerName()) {
                                manifest_files.push_back(std::move(exp_layer_man_file));
                                break;
                            }
                        }
                    }
                }
            }
        }

        // Grab the layer instance extensions information
        size_t num_files = manifest_files.size();
        for (size_t man_file = 0; man_file < num_files; ++man_file) {
            manifest_files[man_file]->GetInstanceExtensionProperties(extension_properties);
        }
    }
    return XR_SUCCESS;
}